

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib555.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  int ec_16;
  CURLMcode ec_15;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int local_21c;
  CURLMcode ec_14;
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval timeout;
  CURLMcode ec_13;
  CURLcode ec_12;
  CURLcode ec_11;
  CURLcode ec_10;
  CURLcode ec_9;
  CURLcode ec_8;
  CURLcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_48;
  int local_3c;
  long lStack_38;
  int running;
  CURLM *m;
  long lStack_28;
  int counter;
  CURL *curl;
  char *pcStack_18;
  int res;
  char *URL_local;
  
  curl._4_4_ = 0;
  lStack_28 = 0;
  m._4_4_ = 0;
  lStack_38 = 0;
  local_3c = 1;
  pcStack_18 = URL;
  tVar7 = tutil_tvnow();
  _ec_1 = tVar7.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_48 = tVar7.tv_usec;
  tv_test_start.tv_usec = local_48;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                  ,0x5e,iVar2,uVar3);
    curl._4_4_ = iVar2;
  }
  if (curl._4_4_ == 0) {
    lStack_28 = curl_easy_init();
    if (lStack_28 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                    ,0x60);
      curl._4_4_ = 0x7c;
    }
    if (curl._4_4_ == 0) {
      iVar2 = curl_easy_setopt(lStack_28,0x2712,pcStack_18);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                      ,0x62,iVar2,uVar3);
        curl._4_4_ = iVar2;
      }
      if (curl._4_4_ == 0) {
        iVar2 = curl_easy_setopt(lStack_28,0x29,1);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                        ,99,iVar2,uVar3);
          curl._4_4_ = iVar2;
        }
        if (curl._4_4_ == 0) {
          iVar2 = curl_easy_setopt(lStack_28,0x2a,1);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                          ,100,iVar2,uVar3);
            curl._4_4_ = iVar2;
          }
          if (curl._4_4_ == 0) {
            iVar2 = curl_easy_setopt(lStack_28,0x4ea2,ioctlcallback);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                            ,0x67,iVar2,uVar3);
              curl._4_4_ = iVar2;
            }
            if (curl._4_4_ == 0) {
              iVar2 = curl_easy_setopt(lStack_28,0x2793,(long)&m + 4);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                              ,0x68,iVar2,uVar3);
                curl._4_4_ = iVar2;
              }
              if (curl._4_4_ == 0) {
                iVar2 = curl_easy_setopt(lStack_28,0x4e2c,readcallback);
                uVar1 = _stderr;
                if (iVar2 != 0) {
                  uVar3 = curl_easy_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                ,0x69,iVar2,uVar3);
                  curl._4_4_ = iVar2;
                }
                if (curl._4_4_ == 0) {
                  iVar2 = curl_easy_setopt(lStack_28,0x2719,(long)&m + 4);
                  uVar1 = _stderr;
                  if (iVar2 != 0) {
                    uVar3 = curl_easy_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                  ,0x6a,iVar2,uVar3);
                    curl._4_4_ = iVar2;
                  }
                  if (curl._4_4_ == 0) {
                    iVar2 = curl_easy_setopt(lStack_28,0x3c,0x24);
                    uVar1 = _stderr;
                    if (iVar2 != 0) {
                      uVar3 = curl_easy_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                    ,0x6d,iVar2,uVar3);
                      curl._4_4_ = iVar2;
                    }
                    if (curl._4_4_ == 0) {
                      iVar2 = curl_easy_setopt(lStack_28,0x2f,1);
                      uVar1 = _stderr;
                      if (iVar2 != 0) {
                        uVar3 = curl_easy_strerror(iVar2);
                        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                      ,0x6f,iVar2,uVar3);
                        curl._4_4_ = iVar2;
                      }
                      if (curl._4_4_ == 0) {
                        iVar2 = curl_easy_setopt(lStack_28,0x2714,libtest_arg2);
                        uVar1 = _stderr;
                        if (iVar2 != 0) {
                          uVar3 = curl_easy_strerror(iVar2);
                          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                        ,0x70,iVar2,uVar3);
                          curl._4_4_ = iVar2;
                        }
                        if (curl._4_4_ == 0) {
                          iVar2 = curl_easy_setopt(lStack_28,0x2716,libtest_arg3);
                          uVar1 = _stderr;
                          if (iVar2 != 0) {
                            uVar3 = curl_easy_strerror(iVar2);
                            curl_mfprintf(uVar1,
                                          "%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                          ,0x71,iVar2,uVar3);
                            curl._4_4_ = iVar2;
                          }
                          if (curl._4_4_ == 0) {
                            iVar2 = curl_easy_setopt(lStack_28,0x6f,0xb);
                            uVar1 = _stderr;
                            if (iVar2 != 0) {
                              uVar3 = curl_easy_strerror(iVar2);
                              curl_mfprintf(uVar1,
                                            "%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                            ,0x73,iVar2,uVar3);
                              curl._4_4_ = iVar2;
                            }
                            if (curl._4_4_ == 0) {
                              lStack_38 = curl_multi_init();
                              if (lStack_38 == 0) {
                                curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                              ,0x75);
                                curl._4_4_ = 0x7b;
                              }
                              if (curl._4_4_ == 0) {
                                iVar2 = curl_multi_add_handle(lStack_38,lStack_28);
                                uVar1 = _stderr;
                                if (iVar2 != 0) {
                                  uVar3 = curl_multi_strerror(iVar2);
                                  curl_mfprintf(uVar1,
                                                "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                                ,0x77,iVar2,uVar3);
                                  curl._4_4_ = iVar2;
                                }
                                if (curl._4_4_ == 0) {
                                  while (local_3c != 0) {
                                    local_21c = -99;
                                    fdread.__fds_bits[0xf] = 0;
                                    iVar2 = curl_multi_perform(lStack_38,&local_3c);
                                    uVar1 = _stderr;
                                    if (iVar2 == 0) {
                                      if (local_3c < 0) {
                                        curl_mfprintf(_stderr,
                                                  "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                                  ,0x81,local_3c);
                                        curl._4_4_ = 0x7a;
                                      }
                                    }
                                    else {
                                      uVar3 = curl_multi_strerror(iVar2);
                                      curl_mfprintf(uVar1,
                                                  "%s:%d curl_multi_perform() failed, with code %d (%s)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                                  ,0x81,iVar2,uVar3);
                                      curl._4_4_ = iVar2;
                                    }
                                    if (curl._4_4_ != 0) break;
                                    tVar7 = tutil_tvnow();
                                    older.tv_usec = tv_test_start.tv_usec;
                                    older.tv_sec = tv_test_start.tv_sec;
                                    lVar4 = tutil_tvdiff(tVar7,older);
                                    if (60000 < lVar4) {
                                      curl_mfprintf(_stderr,
                                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                                  ,0x83);
                                      curl._4_4_ = 0x7d;
                                    }
                                    if ((curl._4_4_ != 0) || (local_3c == 0)) break;
                                    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10;
                                        __arr._4_4_ = __arr._4_4_ + 1) {
                                      fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
                                    }
                                    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10;
                                        __arr_1._4_4_ = __arr_1._4_4_ + 1) {
                                      fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                                    }
                                    for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10;
                                        __arr_2._4_4_ = __arr_2._4_4_ + 1) {
                                      (&ec_14 + (ulong)__arr_2._4_4_ * 2)[0] = CURLM_OK;
                                      (&ec_14 + (ulong)__arr_2._4_4_ * 2)[1] = CURLM_OK;
                                    }
                                    iVar2 = curl_multi_fdset(lStack_38,fdwrite.__fds_bits + 0xf,
                                                             fdexcep.__fds_bits + 0xf,&ec_14,
                                                             &local_21c);
                                    uVar1 = _stderr;
                                    if (iVar2 == 0) {
                                      if (local_21c < -1) {
                                        curl_mfprintf(_stderr,
                                                  "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                                  ,0x90,local_21c);
                                        curl._4_4_ = 0x7a;
                                      }
                                    }
                                    else {
                                      uVar3 = curl_multi_strerror(iVar2);
                                      curl_mfprintf(uVar1,
                                                  "%s:%d curl_multi_fdset() failed, with code %d (%s)\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                                  ,0x90,iVar2,uVar3);
                                      curl._4_4_ = iVar2;
                                    }
                                    if (curl._4_4_ != 0) break;
                                    iVar2 = select_wrapper(local_21c + 1,
                                                           (fd_set *)(fdwrite.__fds_bits + 0xf),
                                                           (fd_set *)(fdexcep.__fds_bits + 0xf),
                                                           (fd_set *)&ec_14,
                                                           (timeval *)(fdread.__fds_bits + 0xf));
                                    if (iVar2 == -1) {
                                      piVar5 = __errno_location();
                                      uVar1 = _stderr;
                                      iVar2 = *piVar5;
                                      pcVar6 = strerror(iVar2);
                                      curl_mfprintf(uVar1,
                                                  "%s:%d select() failed, with errno %d (%s)\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                                  ,0x94,iVar2,pcVar6);
                                      curl._4_4_ = 0x79;
                                    }
                                    if (curl._4_4_ != 0) break;
                                    tVar7 = tutil_tvnow();
                                    older_00.tv_usec = tv_test_start.tv_usec;
                                    older_00.tv_sec = tv_test_start.tv_sec;
                                    lVar4 = tutil_tvdiff(tVar7,older_00);
                                    if (60000 < lVar4) {
                                      curl_mfprintf(_stderr,
                                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib555.c"
                                                  ,0x96);
                                      curl._4_4_ = 0x7d;
                                    }
                                    if (curl._4_4_ != 0) break;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    curl_multi_remove_handle(lStack_38,lStack_28);
    curl_multi_cleanup(lStack_38);
    curl_easy_cleanup(lStack_28);
    curl_global_cleanup();
    URL_local._4_4_ = curl._4_4_;
  }
  else {
    URL_local._4_4_ = curl._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  int counter = 0;
  CURLM *m = NULL;
  int running = 1;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_HEADER, 1L);

  /* read the POST data from a callback */
  easy_setopt(curl, CURLOPT_IOCTLFUNCTION, ioctlcallback);
  easy_setopt(curl, CURLOPT_IOCTLDATA, &counter);
  easy_setopt(curl, CURLOPT_READFUNCTION, readcallback);
  easy_setopt(curl, CURLOPT_READDATA, &counter);
  /* We CANNOT do the POST fine without setting the size (or choose
     chunked)! */
  easy_setopt(curl, CURLOPT_POSTFIELDSIZE, (long)strlen(uploadthis));

  easy_setopt(curl, CURLOPT_POST, 1L);
  easy_setopt(curl, CURLOPT_PROXY, libtest_arg2);
  easy_setopt(curl, CURLOPT_PROXYUSERPWD, libtest_arg3);
  easy_setopt(curl, CURLOPT_PROXYAUTH,
                   (long) (CURLAUTH_NTLM | CURLAUTH_DIGEST | CURLAUTH_BASIC) );

  multi_init(m);

  multi_add_handle(m, curl);

  while(running) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    multi_perform(m, &running);

    abort_on_test_timeout();

#ifdef TPF
    sleep(1); /* avoid ctl-10 dump */
#endif

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, curl);
  curl_multi_cleanup(m);
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}